

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O1

void emit_gri(ASMState *as,x86Group xg,Reg rb,int32_t i)

{
  MCode *pMVar1;
  undefined4 uVar2;
  uint uVar3;
  
  pMVar1 = as->mcp;
  if ((char)(MCode)i == i) {
    pMVar1[-1] = (MCode)i;
    pMVar1 = pMVar1 + -1;
    uVar2 = 0x830000fe;
  }
  else {
    *(int32_t *)(pMVar1 + -4) = i;
    pMVar1 = pMVar1 + -4;
    uVar2 = 0x810000fe;
  }
  pMVar1[-1] = ((byte)rb & 7) + (char)xg * '\b' | 0xc0;
  *(undefined4 *)(pMVar1 + -5) = uVar2;
  uVar3 = rb >> 3 & 1;
  if ((rb >> 1 & 0x100) == 0 && uVar3 == 0) {
    pMVar1 = pMVar1 + -2;
  }
  else {
    pMVar1[-3] = (byte)uVar3 | (byte)(rb >> 0x10) & 8 | 0x40;
    pMVar1 = pMVar1 + -3;
  }
  as->mcp = pMVar1;
  return;
}

Assistant:

static void emit_gri(ASMState *as, x86Group xg, Reg rb, int32_t i)
{
  MCode *p = as->mcp;
  x86Op xo;
  if (checki8(i)) {
    *--p = (MCode)i;
    xo = XG_TOXOi8(xg);
  } else {
    p -= 4;
    *(int32_t *)p = i;
    xo = XG_TOXOi(xg);
  }
  as->mcp = emit_opm(xo, XM_REG, (Reg)(xg & 7) | (rb & REX_64), rb, p, 0);
}